

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O0

void __thiscall
libtorrent::peer_connection::incoming_dht_port(peer_connection *this,int listen_port)

{
  session_interface *psVar1;
  address local_50;
  basic_endpoint<boost::asio::ip::udp> local_30;
  int local_14;
  peer_connection *ppStack_10;
  int listen_port_local;
  peer_connection *this_local;
  
  local_14 = listen_port;
  ppStack_10 = this;
  peer_log(this,incoming_message,"DHT_PORT","p: %d",(ulong)(uint)listen_port);
  psVar1 = (this->super_peer_connection_hot_members).m_ses;
  boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address(&local_50,&this->m_remote);
  boost::asio::ip::basic_endpoint<boost::asio::ip::udp>::basic_endpoint
            (&local_30,&local_50,(unsigned_short)local_14);
  (*(psVar1->super_session_logger)._vptr_session_logger[0x46])(psVar1,&local_30);
  return;
}

Assistant:

void peer_connection::incoming_dht_port(int const listen_port)
	{
		TORRENT_ASSERT(is_single_thread());
		INVARIANT_CHECK;

#ifndef TORRENT_DISABLE_LOGGING
		peer_log(peer_log_alert::incoming_message, "DHT_PORT", "p: %d", listen_port);
#endif
#ifndef TORRENT_DISABLE_DHT
		m_ses.add_dht_node({m_remote.address(), std::uint16_t(listen_port)});
#else
		TORRENT_UNUSED(listen_port);
#endif
	}